

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

QDebug operator<<(QDebug d,QHostAddress *address)

{
  long *plVar1;
  QHostAddress *in_RDX;
  QHostAddressPrivate *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)address);
  plVar1 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar1 + 0x30) = 0;
  pQVar2 = (address->d).d.ptr;
  if (((in_RDX->d).d.ptr)->protocol == '\x02') {
    QVar3.m_data = (storage_type *)0x1f;
    QVar3.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)pQVar2,(QString *)&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (address->d).d.ptr;
    if ((char)pQVar2->a == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
  }
  else {
    QVar4.m_data = (storage_type *)0xd;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)pQVar2,(QString *)&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (address->d).d.ptr;
    if ((char)pQVar2->a == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
    QHostAddress::toString(&local_48,in_RDX);
    if (local_48.d.ptr == (char16_t *)0x0) {
      local_48.d.ptr = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)address,(ulong)local_48.d.ptr);
    pQVar2 = (address->d).d.ptr;
    if ((char)pQVar2->a == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
      pQVar2 = (address->d).d.ptr;
    }
    QTextStream::operator<<((QTextStream *)pQVar2,')');
    pQVar2 = (address->d).d.ptr;
    if ((char)pQVar2->a == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar2,' ');
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar2 = (address->d).d.ptr;
  (address->d).d.ptr = (QHostAddressPrivate *)0x0;
  *(QHostAddressPrivate **)d.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug d, const QHostAddress &address)
{
    QDebugStateSaver saver(d);
    d.resetFormat().nospace();
    if (address == QHostAddress::Any)
        d << "QHostAddress(QHostAddress::Any)";
    else
        d << "QHostAddress(" << address.toString() << ')';
    return d;
}